

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.cpp
# Opt level: O1

bool sqlcheck::IsCreateStatement(string *sql_statement)

{
  long lVar1;
  string create_table_template;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"create table","");
  lVar1 = std::__cxx11::string::find((char *)sql_statement,(ulong)local_38[0],0);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return lVar1 != -1;
}

Assistant:

bool IsCreateStatement(const std::string& sql_statement){
  std::string create_table_template = "create table";
  std::size_t found = sql_statement.find(create_table_template);
  if (found != std::string::npos) {
    return true;
  }

  return false;
}